

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_FeatureVectorizer_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/FeatureVectorizer.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn
            ((FeatureVectorizer_InputColumn *)&_FeatureVectorizer_InputColumn_default_instance_);
  DAT_003cbc58 = 1;
  FeatureVectorizer::FeatureVectorizer((FeatureVectorizer *)&_FeatureVectorizer_default_instance_);
  DAT_003cbc90 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _FeatureVectorizer_InputColumn_default_instance_.DefaultConstruct();
  _FeatureVectorizer_default_instance_.DefaultConstruct();
}